

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapInfo.cpp
# Opt level: O1

DWORD __thiscall Memory::HeapInfo::IdleDecommit(HeapInfo *this)

{
  DWORD DVar1;
  uint uVar2;
  uint uVar3;
  
  DVar1 = IdleDecommitPageAllocator::IdleDecommit
                    (&(this->recyclerPageAllocator).super_IdleDecommitPageAllocator);
  uVar2 = IdleDecommitPageAllocator::IdleDecommit
                    (&(this->recyclerLargeBlockPageAllocator).super_IdleDecommitPageAllocator);
  if (DVar1 < uVar2) {
    uVar2 = DVar1;
  }
  uVar3 = IdleDecommitPageAllocator::IdleDecommit
                    (&(this->recyclerWithBarrierPageAllocator).super_IdleDecommitPageAllocator);
  if (uVar2 < uVar3) {
    uVar3 = uVar2;
  }
  uVar2 = IdleDecommitPageAllocator::IdleDecommit(this->recyclerLeafPageAllocator);
  if (uVar3 < uVar2) {
    uVar2 = uVar3;
  }
  return uVar2;
}

Assistant:

DWORD HeapInfo::IdleDecommit()
{
    DWORD waitTime = INFINITE;
    ForEachPageAllocator([&](IdleDecommitPageAllocator * pageAlloc)
    {
        DWORD pageAllocatorWaitTime = pageAlloc->IdleDecommit();
        waitTime = min(waitTime, pageAllocatorWaitTime);
    });
    return waitTime;
}